

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<const_int_*,_bool> __thiscall
HighsHashTree<int,_void>::InnerLeaf<4>::insert_entry
          (InnerLeaf<4> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  HighsHashTableEntry<int,_void> *pHVar6;
  uint uVar7;
  undefined8 uVar8;
  unsigned_long *puVar9;
  ulong uVar10;
  pair<const_int_*,_bool> pVar11;
  int local_24;
  
  uVar10 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar2 = (byte)(uVar10 >> 10);
  uVar5 = (this->occupation).occupation;
  uVar4 = POPCOUNT(uVar5 >> (bVar2 & 0x3f));
  local_24 = (int)uVar4;
  if ((uVar5 >> (uVar10 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar5 | 1L << (bVar2 & 0x3f);
    uVar7 = this->size;
    if (local_24 < (int)uVar7) {
      puVar9 = (this->hashes)._M_elems + uVar4;
      uVar4 = (ulong)(local_24 - 1);
      do {
        uVar4 = (ulong)((int)uVar4 + 1);
        uVar5 = *puVar9;
        puVar9 = puVar9 + 1;
      } while ((uVar10 & 0xffff) < uVar5);
      goto LAB_00271130;
    }
  }
  else {
    do {
      uVar5 = uVar4;
      uVar4 = uVar5 + 1;
    } while ((uVar10 & 0xffff) < (this->hashes)._M_elems[uVar5 - 1]);
    uVar7 = this->size;
    if (uVar7 + 2 == (int)uVar4) {
      iVar3 = (int)uVar5 + -1;
      goto LAB_00271150;
    }
    do {
      if ((this->hashes)._M_elems[uVar4 - 2] != (uVar10 & 0xffff)) {
        uVar4 = (ulong)((int)uVar4 - 2);
        goto LAB_00271130;
      }
      if (entry->value_ == (this->entries)._M_elems[uVar4 - 2].value_) {
        pHVar6 = (this->entries)._M_elems + ((int)uVar4 + -2);
        uVar8 = 0;
        goto LAB_00271181;
      }
      uVar4 = uVar4 + 1;
    } while (uVar7 + 2 != (int)uVar4);
    uVar4 = (ulong)uVar7;
LAB_00271130:
    local_24 = (int)uVar4;
  }
  iVar3 = (int)uVar4;
  if ((int)uVar4 < (int)uVar7) {
    move_backward(this,&local_24,&this->size);
    iVar3 = local_24;
  }
LAB_00271150:
  pHVar6 = (this->entries)._M_elems + iVar3;
  pHVar6->value_ = entry->value_;
  (this->hashes)._M_elems[iVar3] = uVar10 & 0xffff;
  iVar3 = this->size;
  lVar1 = (long)iVar3 + 1;
  this->size = (int)lVar1;
  (this->hashes)._M_elems[(long)iVar3 + 1] = 0;
  uVar8 = CONCAT71((int7)((ulong)lVar1 >> 8),1);
LAB_00271181:
  pVar11._8_8_ = uVar8;
  pVar11.first = &pHVar6->value_;
  return pVar11;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }